

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O1

ostream * pstore::operator<<(ostream *stream,version_type version)

{
  size_t sVar1;
  char *__s;
  
  if (version - time_based < 6) {
    __s = &DAT_00144274 + *(int *)(&DAT_00144274 + (ulong)(version - time_based) * 4);
  }
  else {
    __s = "";
  }
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar1);
  return stream;
}

Assistant:

std::ostream & operator<< (std::ostream & stream, uuid::version_type const version) {
        char const * str = "";
        switch (version) {
        case uuid::version_type::time_based: str = "time_based"; break;
        case uuid::version_type::dce_security: str = "dce_security"; break;
        case uuid::version_type::name_based_md5: str = "name_based_md5"; break;
        case uuid::version_type::random_number_based: str = "random_number_based"; break;
        case uuid::version_type::name_based_sha1: str = "name_based_sha1"; break;
        case uuid::version_type::unknown: str = "unknown"; break;
        }
        return stream << str;
    }